

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_input_is_finalized(wally_psbt_input *input,size_t *written)

{
  bool bVar1;
  size_t *written_local;
  wally_psbt_input *input_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((input == (wally_psbt_input *)0x0) || (written == (size_t *)0x0)) {
    input_local._4_4_ = -2;
  }
  else {
    bVar1 = true;
    if (input->final_scriptsig == (uchar *)0x0) {
      bVar1 = input->final_witness != (wally_tx_witness_stack *)0x0;
    }
    *written = (long)(int)(uint)bVar1;
    input_local._4_4_ = 0;
  }
  return input_local._4_4_;
}

Assistant:

int wally_psbt_input_is_finalized(const struct wally_psbt_input *input,
                                  size_t *written)
{
    if (written)
        *written = 0;
    if (!input || !written)
        return WALLY_EINVAL;
    *written = input->final_scriptsig || input->final_witness ? 1 : 0;
    return WALLY_OK;
}